

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

vec3_t tri3_get_point_barycentric_coordinates(vec3_t v0,vec3_t v1,vec3_t v2,vec3_t p)

{
  mat3_t m_00;
  float fVar1;
  vec3_t vVar2;
  mat3_t m;
  undefined4 uStack_74;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_24;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_10;
  
  fVar1 = p.z;
  uStack_74 = v1.x;
  m_00.m[1][0] = uStack_74;
  m_00.m[0][2] = v0.z;
  m_00._0_8_ = v0._0_8_;
  m_00._16_8_ = v1._4_8_;
  m_00._24_8_ = v2._0_8_;
  m_00.m[2][2] = v2.z;
  mat3_inverse(m_00);
  local_58 = p.x;
  uStack_54 = p.y;
  vVar2.x = fVar1 * (float)local_18 + local_58 * (float)local_30 + (float)local_24 * uStack_54;
  vVar2.y = fVar1 * (float)((ulong)local_18 >> 0x20) +
            local_58 * (float)((ulong)local_30 >> 0x20) +
            (float)((ulong)local_24 >> 0x20) * uStack_54;
  vVar2.z = fVar1 * local_10 + local_28 * local_58 + local_1c * uStack_54;
  return vVar2;
}

Assistant:

vec3_t
tri3_get_point_barycentric_coordinates(vec3_t v0, vec3_t v1, vec3_t v2, vec3_t p) {
    mat3_t  m   = mat3(v0.x, v0.y, v0.z,
                       v1.x, v1.y, v1.z,
                       v2.x, v2.y, v2.z);
    return mat3_mul_vec3(mat3_inverse(m), vec3(p.x, p.y, p.z));
}